

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O1

char * BN_bn2hex(BIGNUM *a)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  
  uVar3 = bn_minimal_width((BIGNUM *)a);
  pcVar5 = (char *)OPENSSL_malloc((long)(int)(uVar3 << 4 | 3));
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar9 = pcVar5;
    if (a->neg != 0) {
      pcVar9 = pcVar5 + 1;
      *pcVar5 = '-';
    }
    iVar4 = BN_is_zero((BIGNUM *)a);
    if (iVar4 != 0) {
      *pcVar9 = '0';
      pcVar9 = pcVar9 + 1;
    }
    if (0 < (int)uVar3) {
      bVar2 = false;
      uVar6 = (ulong)uVar3;
      do {
        lVar7 = 0x38;
        do {
          uVar8 = a->d[uVar6 - 1] >> ((byte)lVar7 & 0x3f);
          uVar3 = (uint)uVar8;
          bVar1 = (uVar8 & 0xff) != 0;
          if (bVar2 || bVar1) {
            *pcVar9 = "0123456789abcdef"[(uVar3 & 0xff) >> 4];
            pcVar9[1] = "0123456789abcdef"[uVar3 & 0xf];
            pcVar9 = pcVar9 + 2;
          }
          bVar2 = bVar2 || bVar1;
          lVar7 = lVar7 + -8;
        } while (lVar7 != -8);
        bVar1 = 1 < (long)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
    }
    *pcVar9 = '\0';
  }
  return pcVar5;
}

Assistant:

char *BN_bn2hex(const BIGNUM *bn) {
  int width = bn_minimal_width(bn);
  char *buf = reinterpret_cast<char *>(
      OPENSSL_malloc(1 /* leading '-' */ + 1 /* zero is non-empty */ +
                     width * BN_BYTES * 2 + 1 /* trailing NUL */));
  if (buf == NULL) {
    return NULL;
  }

  char *p = buf;
  if (bn->neg) {
    *(p++) = '-';
  }

  if (BN_is_zero(bn)) {
    *(p++) = '0';
  }

  int z = 0;
  for (int i = width - 1; i >= 0; i--) {
    for (int j = BN_BITS2 - 8; j >= 0; j -= 8) {
      // strip leading zeros
      int v = ((int)(bn->d[i] >> (long)j)) & 0xff;
      if (z || v != 0) {
        *(p++) = hextable[v >> 4];
        *(p++) = hextable[v & 0x0f];
        z = 1;
      }
    }
  }
  *p = '\0';

  return buf;
}